

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlineCall(Inline *this,Instr *callInstr,FunctionJITTimeInfo *funcInfo,
                  FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,bool *pIsInlined,
                  uint callSiteId,uint recursiveInlineDepth,bool isCallInstanceFunction)

{
  Func *pFVar1;
  Opnd *pOVar2;
  code *pcVar3;
  BuiltinFunction BVar4;
  bool bVar5;
  ArgSlot AVar6;
  OpCode opcode;
  uint uVar7;
  uint uVar8;
  JITTimeFunctionBody *this_00;
  Instr *pIVar9;
  undefined4 *puVar10;
  char16 *inlineeName;
  FunctionJITTimeInfo *topFunc;
  Instr *pIVar11;
  RegOpnd *pRVar12;
  IntConstOpnd *newSrc;
  StackSym *pSVar13;
  SymOpnd *dstOpnd;
  Instr **ppIVar14;
  uint builtIn;
  StackSym *pSVar15;
  FunctionJITTimeInfo *local_a0;
  Instr *local_98;
  Instr *argImplicitThisInstr;
  Instr *argSecond;
  Instr *local_80;
  Func *local_78;
  Instr *local_70;
  Instr *returnInstr;
  uint local_5c;
  ArgSlot AStack_58;
  uint actualCount;
  Instr *local_50;
  Instr *local_48;
  Instr *local_40;
  SymOpnd *local_38;
  
  local_40 = callInstr->m_next;
  pFVar1 = callInstr->m_func;
  returnInstr = (Instr *)funcInfo;
  _AStack_58 = symCallerThis;
  local_50 = callInstr;
  local_38 = (SymOpnd *)inlinerData;
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(funcInfo);
  BVar4 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar7);
  local_48 = (Instr *)CONCAT71(local_48._1_7_,BVar4._value);
  *pIsInlined = false;
  uVar7 = Func::GetSourceContextId(this->topFunc);
  uVar8 = Func::GetLocalFunctionId(this->topFunc);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineCallPhase,uVar7,uVar8);
  if (!bVar5) {
    uVar7 = Func::GetSourceContextId(pFVar1);
    local_78 = pFVar1;
    uVar8 = Func::GetLocalFunctionId(pFVar1);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineCallPhase,uVar7,uVar8);
    if (bVar5) {
      return local_40;
    }
    this_00 = Func::GetJITFunctionBody(this->topFunc);
    AVar6 = JITTimeFunctionBody::GetInParamsCount(this_00);
    if (AVar6 == 0) {
      return local_40;
    }
    pOVar2 = local_50->m_src2;
    pIVar9 = GetDefInstr(pOVar2);
    bVar5 = IR::Opnd::IsSymOpnd(pIVar9->m_src2);
    if (!bVar5) {
      return local_40;
    }
    *pIsInlined = true;
    local_70 = (Instr *)0x0;
    uVar7 = Func::GetSourceContextId(this->topFunc);
    uVar8 = Func::GetLocalFunctionId(this->topFunc);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineCallTargetPhase,uVar7,uVar8);
    if ((!bVar5) &&
       (bVar5 = InlineCallTarget(this,local_50,(FunctionJITTimeInfo *)local_38,&local_a0,
                                 (FunctionJITTimeInfo *)returnInstr,_AStack_58,&local_70,
                                 recursiveInlineDepth,isCallInstanceFunction), bVar5)) {
      if (local_70 != (Instr *)0x0) {
        return local_70;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xcd0,"(returnInstr)","returnInstr");
      if (bVar5) {
        *puVar10 = 0;
        return local_70;
      }
LAB_005071d9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    builtIn = (uint)local_48._0_1_;
    _AStack_58 = (StackSym *)(ulong)isCallInstanceFunction;
    inlineeName = Js::JavascriptLibrary::GetNameForBuiltIn(local_48._0_1_);
    topFunc = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    bVar5 = Func::IsLoopBody(local_50->m_func->topFunc);
    TraceInlining((FunctionJITTimeInfo *)local_38,inlineeName,(char16 *)0x0,0,topFunc,0,
                  (FunctionJITTimeInfo *)0x0,callSiteId,bVar5,builtIn);
    local_5c = 0;
    bVar5 = IR::Opnd::IsSymOpnd(pOVar2);
    pFVar1 = local_78;
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xcdb,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
      if (!bVar5) goto LAB_005071d9;
      *puVar10 = 0;
    }
    pIVar9 = local_50;
    local_98 = (Instr *)0x0;
    argImplicitThisInstr = (Instr *)0x0;
    GetArgInstrsForCallAndApply(this,local_50,&local_98,&argImplicitThisInstr,&argSecond,&local_5c);
    pSVar15 = _AStack_58;
    ppIVar14 = &local_98;
    if (isCallInstanceFunction) {
      ppIVar14 = &argImplicitThisInstr;
    }
    local_48 = *ppIVar14;
    if (local_48 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xce5,"(functionInstr)","functionInstr");
      if (!bVar5) goto LAB_005071d9;
      *puVar10 = 0;
    }
    local_38 = IR::Opnd::AsSymOpnd(pIVar9->m_src2);
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns
              (this,pIVar9,pIVar9,(FunctionJITTimeInfo *)returnInstr,false,true,false,true);
    uVar7 = local_5c;
    pIVar11 = InsertInlineeBuiltInStartEndTags(this,pIVar9,local_5c,(Instr **)0x0);
    pIVar11->m_opcode = InlineNonTrackingBuiltInEnd;
    pSVar15 = (StackSym *)(ulong)(~(uint)pSVar15 + uVar7);
    pIVar11 = IR::Instr::New(StartCall,pFVar1);
    pRVar12 = IR::RegOpnd::New(TyVar,pFVar1);
    IR::Instr::SetDst(pIVar11,&pRVar12->super_Opnd);
    newSrc = IR::IntConstOpnd::New((IntConstType)pSVar15,TyInt32,pFVar1,false);
    IR::Instr::SetSrc1(pIVar11,&newSrc->super_Opnd);
    local_80 = pIVar11;
    IR::Instr::InsertBefore(pIVar9,pIVar11);
    IR::Instr::ReplaceSrc1(pIVar9,local_48->m_src1);
    IR::Instr::UnlinkSrc2(pIVar9);
    pIVar9->m_opcode = CallI;
    pIVar11 = (Instr *)0x0;
    for (; (int)pSVar15 != 0; pSVar15 = (StackSym *)(ulong)((int)pSVar15 - 1)) {
      returnInstr = pIVar9;
      pIVar11 = GetDefInstr(&local_38->super_Opnd);
      local_38 = IR::Opnd::AsSymOpnd(pIVar11->m_src2);
      pOVar2 = pIVar11->m_src1;
      pSVar13 = IR::Opnd::GetStackSym(pOVar2);
      pIVar9 = local_48;
      pSVar13 = StackSym::New(pSVar13->m_type,local_48->m_func);
      pRVar12 = IR::RegOpnd::New(pSVar13,pOVar2->m_type,pIVar9->m_func);
      _AStack_58 = pSVar15;
      opcode = Func::GetLoadOpForType(pOVar2->m_type);
      pIVar9 = IR::Instr::New(opcode,&pRVar12->super_Opnd,pOVar2,pIVar9->m_func);
      IR::Instr::SetByteCodeOffset(pIVar9,pIVar11);
      IR::Opnd::SetIsJITOptimizedReg(&pRVar12->super_Opnd,true);
      IR::Instr::InsertBefore(pIVar11,pIVar9);
      pSVar13 = SymTable::GetArgSlotSym(local_50->m_func->m_symTable,AStack_58);
      pFVar1 = local_78;
      dstOpnd = IR::SymOpnd::New(&pSVar13->super_Sym,0,TyVar,local_78);
      pIVar9 = IR::Instr::New(ArgOut_A,&dstOpnd->super_Opnd,&pRVar12->super_Opnd,pFVar1);
      pIVar11 = returnInstr;
      IR::Instr::SetSrc2(returnInstr,&dstOpnd->super_Opnd);
      IR::Instr::InsertBefore(pIVar11,pIVar9);
      pIVar11 = pIVar9;
    }
    IR::Instr::SetSrc2(pIVar11,local_80->m_dst);
    pIVar9 = GetDefInstr(&local_38->super_Opnd);
    if (pIVar9 != local_48) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xd16,"(GetDefInstr(orgLinkOpnd) == functionInstr)",
                         "GetDefInstr(orgLinkOpnd) == functionInstr");
      if (!bVar5) goto LAB_005071d9;
      *puVar10 = 0;
    }
  }
  return local_40;
}

Assistant:

IR::Instr*
Inline::InlineCall(IR::Instr *callInstr, const FunctionJITTimeInfo *funcInfo, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, bool* pIsInlined, uint callSiteId, uint recursiveInlineDepth, bool isCallInstanceFunction)
{
    IR::Instr* instrNext = callInstr->m_next;
    Func *func = callInstr->m_func;
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(funcInfo->GetLocalFunctionId());

    *pIsInlined = false;
    if (PHASE_OFF(Js::InlineCallPhase, this->topFunc) || PHASE_OFF(Js::InlineCallPhase, func)
        || !this->topFunc->GetJITFunctionBody()->GetInParamsCount())
    {
        return instrNext;
    }

    // Convert all the current ARG_OUT to  ArgOut_A_InlineBuiltIn
    IR::Opnd *linkOpnd = callInstr->GetSrc2();

    if (!GetDefInstr(linkOpnd)->GetSrc2()->IsSymOpnd())
    {
        // There is no benefit of inlining.call() with no arguments.
        return instrNext;
    }

    *pIsInlined = true;
    const FunctionJITTimeInfo * inlineeData = nullptr;

    IR::Instr * returnInstr = nullptr;
    if (!PHASE_OFF(Js::InlineCallTargetPhase, this->topFunc))
    {
        if (InlineCallTarget(callInstr, inlinerData, &inlineeData, funcInfo, symCallerThis, &returnInstr, recursiveInlineDepth, isCallInstanceFunction))
        {
            Assert(returnInstr);
            return returnInstr;
        }
    }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    TraceInlining(inlinerData, Js::JavascriptLibrary::GetNameForBuiltIn(builtInId),
        nullptr, 0, this->topFunc->GetWorkItem()->GetJITTimeInfo(), 0, nullptr, callSiteId, callInstr->m_func->GetTopFunc()->IsLoopBody(), builtInId);
#endif

    uint actualCount = 0;
    Assert(linkOpnd->IsSymOpnd());

    // We are trying to optimize this.superConstructor.call(this, a, b,c);
    // argImplicitInstr represents this.superConstructor which we need to call directly.
    IR::Instr * argImplicitThisInstr = nullptr;
    IR::Instr * argSecond = nullptr;
    IR::Instr * dummyInstr = nullptr;
    this->GetArgInstrsForCallAndApply(callInstr, &argImplicitThisInstr, &argSecond, &dummyInstr, actualCount);

    IR::Instr * functionInstr = isCallInstanceFunction ? argSecond : argImplicitThisInstr;
    Assert(functionInstr);

    IR::SymOpnd* orgLinkOpnd = callInstr->GetSrc2()->AsSymOpnd();

    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, funcInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, actualCount);
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    uint actualCountToInlinedCall = actualCount - (isCallInstanceFunction ? 2 : 1);

    IR::Instr *startCall = IR::Instr::New(Js::OpCode::StartCall, func);
    startCall->SetDst(IR::RegOpnd::New(TyVar, func));
    startCall->SetSrc1(IR::IntConstOpnd::New(actualCountToInlinedCall, TyInt32, func)); // New call will have one less parameter.

    callInstr->InsertBefore(startCall);

    callInstr->ReplaceSrc1(functionInstr->GetSrc1());
    callInstr->UnlinkSrc2();
    callInstr->m_opcode = Js::OpCode::CallI;

    IR::Instr* insertBeforeInstr = callInstr;
    IR::Instr* clonedArgout = nullptr;
    IR::Instr* orgArgout = nullptr;

    for (uint i = actualCountToInlinedCall ; i > 0; i--)
    {
        orgArgout = GetDefInstr(orgLinkOpnd);
        orgLinkOpnd = orgArgout->GetSrc2()->AsSymOpnd();
        IR::Opnd *orgSrc1 = orgArgout->GetSrc1();

        // Change ArgOut to use temp as src1.
        StackSym * stackSym = StackSym::New(orgSrc1->GetStackSym()->GetType(), functionInstr->m_func);
        IR::Opnd* tempDst = IR::RegOpnd::New(stackSym, orgSrc1->GetType(), functionInstr->m_func);
        IR::Instr *assignInstr = IR::Instr::New(Func::GetLoadOpForType(orgSrc1->GetType()), tempDst, orgSrc1, functionInstr->m_func);
        assignInstr->SetByteCodeOffset(orgArgout);
        tempDst->SetIsJITOptimizedReg(true);
        orgArgout->InsertBefore(assignInstr);

        StackSym *symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(i));
        IR::SymOpnd* newLinkOpnd = IR::SymOpnd::New(symDst, 0, TyVar, func);

        clonedArgout = IR::Instr::New(Js::OpCode::ArgOut_A, newLinkOpnd, tempDst, func);
        insertBeforeInstr->SetSrc2(newLinkOpnd);

        insertBeforeInstr->InsertBefore(clonedArgout);
        insertBeforeInstr = clonedArgout;
    }
    clonedArgout->SetSrc2(startCall->GetDst());
    Assert(GetDefInstr(orgLinkOpnd) == functionInstr);
    return instrNext;
}